

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O3

void uavs3d_funs_init_mc_c(void)

{
  long lVar1;
  
  lVar1 = -6;
  do {
    *(undefined4 *)(uavs3d_funs_handle.ipflt[0] + lVar1) = 0x11623c;
    *(undefined4 *)((long)uavs3d_funs_handle.ipflt[0] + lVar1 * 8 + 4) = 0;
    *(undefined4 *)(uavs3d_funs_handle.ipflt[0] + lVar1 + 1) = 0x11623c;
    *(undefined4 *)((long)uavs3d_funs_handle.ipflt[0] + lVar1 * 8 + 0xc) = 0;
    *(undefined4 *)(uavs3d_funs_handle.ipflt[1] + lVar1) = 0x117798;
    *(undefined4 *)((long)uavs3d_funs_handle.ipflt[1] + lVar1 * 8 + 4) = 0;
    *(undefined4 *)(uavs3d_funs_handle.ipflt[1] + lVar1 + 1) = 0x117798;
    *(undefined4 *)((long)uavs3d_funs_handle.ipflt[1] + lVar1 * 8 + 0xc) = 0;
    *(undefined4 *)(uavs3d_funs_handle.ipflt[2] + lVar1) = 0x117828;
    *(undefined4 *)
     ((long)*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
             (uavs3d_funs_handle.ipflt_ext + -2) + lVar1 * 8 + 4) = 0;
    *(undefined4 *)
     (*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
       (uavs3d_funs_handle.ipflt_ext + -2) + lVar1 + 1) = 0x117828;
    *(undefined4 *)
     ((long)*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
             (uavs3d_funs_handle.ipflt_ext + -2) + lVar1 * 8 + 0xc) = 0;
    *(undefined4 *)
     (*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
       (uavs3d_funs_handle.ipflt_ext + -1) + lVar1) = 0x117934;
    *(undefined4 *)
     ((long)*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
             (uavs3d_funs_handle.ipflt_ext + -1) + lVar1 * 8 + 4) = 0;
    *(undefined4 *)
     (*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
       (uavs3d_funs_handle.ipflt_ext + -1) + lVar1 + 1) = 0x117934;
    *(undefined4 *)
     ((long)*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
             (uavs3d_funs_handle.ipflt_ext + -1) + lVar1 * 8 + 0xc) = 0;
    *(undefined4 *)(uavs3d_funs_handle.ipflt_ext[0] + lVar1) = 0x117aa3;
    *(undefined4 *)((long)uavs3d_funs_handle.avg_pel + lVar1 * 8 + -0x5c) = 0;
    *(undefined4 *)(uavs3d_funs_handle.avg_pel + lVar1 + -0xb) = 0x117aa3;
    *(undefined4 *)((long)uavs3d_funs_handle.avg_pel + lVar1 * 8 + -0x54) = 0;
    *(undefined4 *)(uavs3d_funs_handle.avg_pel + lVar1 + -6) = 0x117bec;
    *(undefined4 *)((long)uavs3d_funs_handle.avg_pel + lVar1 * 8 + -0x2c) = 0;
    *(undefined4 *)(uavs3d_funs_handle.avg_pel + lVar1 + -5) = 0x117bec;
    *(undefined4 *)((long)uavs3d_funs_handle.avg_pel + lVar1 * 8 + -0x24) = 0;
    *(undefined4 *)(uavs3d_funs_handle.avg_pel + lVar1) = 0x118147;
    *(undefined4 *)((long)uavs3d_funs_handle.avg_pel + lVar1 * 8 + 4) = 0;
    *(undefined4 *)(uavs3d_funs_handle.avg_pel + lVar1 + 1) = 0x118147;
    *(undefined4 *)((long)uavs3d_funs_handle.avg_pel + lVar1 * 8 + 0xc) = 0;
    *(undefined4 *)(uavs3d_funs_handle.recon_luma + lVar1 + -1) = 0x1185ae;
    *(undefined4 *)((long)uavs3d_funs_handle.recon_luma + lVar1 * 8 + -4) = 0;
    *(undefined4 *)(uavs3d_funs_handle.recon_luma + lVar1) = 0x1185ae;
    *(undefined4 *)((long)uavs3d_funs_handle.recon_luma + lVar1 * 8 + 4) = 0;
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0);
  return;
}

Assistant:

void uavs3d_funs_init_mc_c() {
    int i;
    for (i = 0; i < BLOCK_WIDTH_TYPES_NUM; i++) {
        uavs3d_funs_handle.ipcpy[i] = uavs3d_if_cpy;
        uavs3d_funs_handle.ipflt[IPFILTER_H_8][i] = uavs3d_if_hor_luma;
        uavs3d_funs_handle.ipflt[IPFILTER_H_4][i] = uavs3d_if_hor_chroma;
        uavs3d_funs_handle.ipflt[IPFILTER_V_8][i] = uavs3d_if_ver_luma;
        uavs3d_funs_handle.ipflt[IPFILTER_V_4][i] = uavs3d_if_ver_chroma;
        uavs3d_funs_handle.ipflt_ext[IPFILTER_EXT_8][i] = uavs3d_if_hor_ver_luma;
        uavs3d_funs_handle.ipflt_ext[IPFILTER_EXT_4][i] = uavs3d_if_hor_ver_chroma;
        uavs3d_funs_handle.avg_pel[i]   = uavs3d_avg_pel;
    }
}